

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_buffer.cpp
# Opt level: O2

void __thiscall
BmsBuffer::GetObjectExistBar(BmsBuffer *this,set<int,_std::less<int>,_std::allocator<int>_> *barmap)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->array_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->array_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)barmap,
               (int *)(p_Var1 + 1));
  }
  return;
}

Assistant:

void
BmsBuffer::GetObjectExistBar(std::set<barindex> &barmap) const
{
	for (auto it = Begin(); it != End(); ++it) {
		barmap.insert(it->first);
	}
}